

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram-cache.cpp
# Opt level: O0

void common_ngram_cache_save(common_ngram_cache *ngram_cache,string *filename)

{
  bool bVar1;
  size_type sVar2;
  reference __p;
  string *in_RSI;
  undefined8 in_RDI;
  undefined1 auVar3 [12];
  int32_t count;
  llama_token token;
  pair<int,_int> item2;
  iterator __end2;
  iterator __begin2;
  common_ngram_cache_part *__range2;
  int32_t ntokens;
  common_ngram_cache_part token_counts;
  common_ngram ngram;
  pair<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  item;
  iterator __end1;
  iterator __begin1;
  common_ngram_cache *__range1;
  ofstream file_out;
  pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  *in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  pair<int,_int> local_2f8;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_2f0;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_2e8;
  undefined1 *local_2e0;
  int local_2d4;
  undefined1 local_2d0 [56];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined4 local_27c;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  _Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
  local_228;
  _Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
  local_220;
  undefined8 local_218;
  char local_210 [520];
  undefined8 local_8;
  
  local_8 = in_RDI;
  std::ofstream::ofstream(local_210,in_RSI,_S_bin);
  local_218 = local_8;
  local_220._M_cur =
       (__node_type *)
       std::
       unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
       ::begin((unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                *)in_stack_fffffffffffffcf8);
  local_228._M_cur =
       (__node_type *)
       std::
       unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
       ::end((unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
              *)in_stack_fffffffffffffcf8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_220,&local_228);
    if (!bVar1) {
      std::ofstream::~ofstream(local_210);
      return;
    }
    std::__detail::
    _Node_iterator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_false,_true>
    ::operator*((_Node_iterator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_false,_true>
                 *)0x361ce6);
    std::
    pair<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
    ::
    pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_true>
              ((pair<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcf8);
    local_298 = local_270;
    uStack_290 = uStack_268;
    std::
    unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                    (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)in_stack_fffffffffffffcf8);
    bVar1 = std::
            unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::empty((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)0x361d23);
    if (bVar1) break;
    sVar2 = std::
            unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::size((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)0x361dab);
    local_2d4 = (int)sVar2;
    if (local_2d4 < 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                 ,0xcf,"GGML_ASSERT(%s) failed","ntokens > 0");
    }
    std::ostream::write(local_210,(long)&local_298);
    std::ostream::write(local_210,(long)&local_2d4);
    local_2e0 = local_2d0;
    local_2e8._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
         ::begin((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)in_stack_fffffffffffffcf8);
    local_2f0._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
         ::end((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                *)in_stack_fffffffffffffcf8);
    while( true ) {
      bVar1 = std::__detail::operator!=(&local_2e8,&local_2f0);
      if (!bVar1) break;
      __p = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator*
                      ((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)0x361e55);
      std::pair<int,_int>::pair<const_int,_int,_true>(&local_2f8,__p);
      in_stack_fffffffffffffd00 = local_2f8.second;
      in_stack_fffffffffffffd04 = local_2f8.first;
      if (local_2f8.second < 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                   ,0xd6,"GGML_ASSERT(%s) failed","count > 0");
      }
      std::ostream::write(local_210,(long)&stack0xfffffffffffffd04);
      std::ostream::write(local_210,(long)&stack0xfffffffffffffd00);
      std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator++
                ((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    }
    std::
    unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                      *)0x361eeb);
    std::
    pair<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
    ::~pair((pair<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
             *)0x361ef8);
    std::__detail::
    _Node_iterator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_false,_true>
                  *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  }
  auVar3 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                      ,0xcd,"GGML_ASSERT(%s) failed","!token_counts.empty()");
  local_27c = auVar3._8_4_;
  local_278 = auVar3._0_8_;
  std::ofstream::~ofstream(local_210);
  _Unwind_Resume(local_278);
}

Assistant:

void common_ngram_cache_save(common_ngram_cache & ngram_cache, std::string & filename) {
    std::ofstream file_out(filename, std::ios::binary);
    for (std::pair<common_ngram, common_ngram_cache_part> item : ngram_cache) {
        const common_ngram      ngram        = item.first;
        common_ngram_cache_part token_counts = item.second;
        GGML_ASSERT(!token_counts.empty());
        const int32_t ntokens = token_counts.size();
        GGML_ASSERT(ntokens > 0);

        file_out.write(reinterpret_cast<const char *>(&ngram),   sizeof(common_ngram));
        file_out.write(reinterpret_cast<const char *>(&ntokens), sizeof(int32_t));
        for (std::pair<llama_token, int32_t> item2 : token_counts) {
            const llama_token token = item2.first;
            const int32_t     count = item2.second;
            GGML_ASSERT(count > 0);

            file_out.write(reinterpret_cast<const char *>(&token), sizeof(llama_token));
            file_out.write(reinterpret_cast<const char *>(&count), sizeof(int32_t));
        }
    }

}